

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<double> * __thiscall
tinyusdz::primvar::PrimVar::get_ts_time
          (optional<double> *__return_storage_ptr__,PrimVar *this,size_t idx)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  optional<double> local_38;
  ulong local_20;
  size_t idx_local;
  PrimVar *this_local;
  
  local_20 = idx;
  idx_local = (size_t)this;
  this_local = (PrimVar *)__return_storage_ptr__;
  bVar2 = has_timesamples(this);
  uVar1 = local_20;
  if (bVar2) {
    sVar3 = tinyusdz::value::TimeSamples::size(&this->_ts);
    if (uVar1 < sVar3) {
      tinyusdz::value::TimeSamples::get_time(&local_38,&this->_ts,local_20);
      nonstd::optional_lite::optional<double>::optional<double,_0>(__return_storage_ptr__,&local_38)
      ;
      nonstd::optional_lite::optional<double>::~optional(&local_38);
    }
    else {
      nonstd::optional_lite::optional<double>::optional(__return_storage_ptr__);
    }
  }
  else {
    nonstd::optional_lite::optional<double>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<double> get_ts_time(size_t idx) const {

    if (!has_timesamples()) {
      return nonstd::nullopt;
    }

    if (idx >= _ts.size()) {
      return nonstd::nullopt;
    }

    return _ts.get_time(idx);
  }